

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O2

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneBspTree::items
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsSceneBspTree *this,QRectF *rect,
          bool onlyTopLevelItems)

{
  ulong *puVar1;
  Type TVar2;
  Node *pNVar3;
  QGraphicsItem **ppQVar4;
  long lVar5;
  long lVar6;
  add_const_t<QList<QGraphicsItem_*>_> *__range1;
  long in_FS_OFFSET;
  double dVar7;
  anon_class_16_2_a6e56972 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QGraphicsItem **)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_38.foundItems = __return_storage_ptr__;
  local_38.onlyTopLevelItems = onlyTopLevelItems;
  if ((this->nodes).d.size == 0) goto LAB_005b0b4c;
  pNVar3 = (this->nodes).d.ptr;
  TVar2 = pNVar3->type;
  if (TVar2 == Horizontal) {
    if (rect->yp <= (pNVar3->field_0).offset && (pNVar3->field_0).offset != rect->yp) {
      climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>(this,&local_38,rect,1);
      dVar7 = rect->yp + rect->h;
LAB_005b0b33:
      if (dVar7 < (pNVar3->field_0).offset) goto LAB_005b0b4c;
    }
  }
  else {
    if (TVar2 != Vertical) {
      if (TVar2 == Leaf) {
        items::anon_class_16_2_a6e56972::operator()
                  (&local_38,(this->leaves).d.ptr + (pNVar3->field_0).leafIndex);
      }
      goto LAB_005b0b4c;
    }
    if (rect->xp <= (pNVar3->field_0).offset && (pNVar3->field_0).offset != rect->xp) {
      climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>(this,&local_38,rect,1);
      dVar7 = rect->xp + rect->w;
      goto LAB_005b0b33;
    }
  }
  climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>(this,&local_38,rect,2);
LAB_005b0b4c:
  ppQVar4 = (__return_storage_ptr__->d).ptr;
  lVar5 = (__return_storage_ptr__->d).size;
  for (lVar6 = 0; lVar5 << 3 != lVar6; lVar6 = lVar6 + 8) {
    puVar1 = (ulong *)(*(long *)(*(long *)((long)ppQVar4 + lVar6) + 8) + 0x160);
    *puVar1 = *puVar1 & 0xffffffffffffbfff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneBspTree::items(const QRectF &rect, bool onlyTopLevelItems) const
{
    QList<QGraphicsItem *> foundItems;
    climbTree([&foundItems, onlyTopLevelItems](QList<QGraphicsItem *> *items) {
        for (int i = 0; i < items->size(); ++i) {
            QGraphicsItem *item = items->at(i);
            if (onlyTopLevelItems && item->d_ptr->parent)
                item = item->topLevelItem();
            if (!item->d_func()->itemDiscovered && item->d_ptr->visible) {
                item->d_func()->itemDiscovered = 1;
                foundItems.prepend(item);
            }
        }
    }, rect);
    // Reset discovery bits.
    for (const auto &foundItem : std::as_const(foundItems))
        foundItem->d_ptr->itemDiscovered = 0;
    return foundItems;
}